

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O1

void Eigen::internal::
     generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,8>
     ::scaleAndAddTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
               (Matrix<double,__1,__1,_0,__1,__1> *dst,Matrix<double,__1,__1,_0,__1,__1> *a_lhs,
               Matrix<double,__1,__1,_0,__1,__1> *a_rhs,Scalar *alpha)

{
  long lVar1;
  long lVar2;
  XprTypeNested pMVar3;
  XprTypeNested pMVar4;
  long lVar5;
  char *pcVar6;
  BlockingType blocking;
  undefined1 local_98 [16];
  variable_if_dynamic<long,__1> local_88;
  Matrix<double,__1,__1,_0,__1,__1> *pMStack_80;
  variable_if_dynamic<long,__1> local_78;
  variable_if_dynamic<long,__1> vStack_70;
  long local_68;
  XprTypeNested local_60;
  undefined1 local_58 [24];
  Matrix<double,__1,__1,_0,__1,__1> *local_40;
  variable_if_dynamic<long,__1> local_38;
  variable_if_dynamic<long,__1> vStack_30;
  long local_28;
  
  lVar1 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  lVar2 = (a_lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
  ;
  if (lVar1 == lVar2) {
    pMVar3 = (XprTypeNested)
             (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_cols;
    pMVar4 = (XprTypeNested)
             (a_rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_cols;
    if (pMVar3 == pMVar4) {
      if (((pMVar4 == (XprTypeNested)0x0) || (lVar2 == 0)) ||
         (lVar5 = (a_lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                  m_storage.m_cols, lVar5 == 0)) {
        return;
      }
      if (pMVar3 == (XprTypeNested)0x1) {
        local_98._0_8_ =
             (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
        local_98._8_8_ = lVar1;
        if (lVar1 < 0 && (double *)local_98._0_8_ != (double *)0x0) {
          pcVar6 = 
          "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
          ;
        }
        else {
          local_78.m_value = 0;
          vStack_70.m_value = 0;
          local_58._0_8_ =
               (a_rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
          local_58._8_8_ =
               (a_rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_rows;
          local_68 = lVar1;
          if (-1 < (long)local_58._8_8_ ||
              (Matrix<double,__1,__1,_0,__1,__1> *)local_58._0_8_ ==
              (Matrix<double,__1,__1,_0,__1,__1> *)0x0) {
            local_38.m_value = 0;
            vStack_30.m_value = 0;
            local_40 = a_rhs;
            local_28 = local_58._8_8_;
            if (0 < (long)pMVar4) {
              pMStack_80 = dst;
              generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>const,Eigen::DenseShape,Eigen::DenseShape,7>
              ::scaleAndAddTo<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
                        ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_98,
                         a_lhs,(Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *
                               )local_58,alpha);
              return;
            }
            pcVar6 = 
            "Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = const Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
            ;
LAB_00140895:
            vStack_30.m_value = 0;
            local_38.m_value = 0;
            vStack_70.m_value = 0;
            local_78.m_value = 0;
            pMStack_80 = dst;
            __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Block.h"
                          ,0x7a,pcVar6);
          }
          pcVar6 = 
          "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
          ;
          pMStack_80 = dst;
        }
      }
      else {
        if (lVar1 != 1) {
          local_60 = (XprTypeNested)*alpha;
          local_98._0_8_ = (PointerType)0x0;
          local_98._8_8_ = (void *)0x0;
          local_88.m_value = lVar1;
          pMStack_80 = pMVar3;
          local_78.m_value = lVar5;
          evaluateProductBlockingSizesHeuristic<double,double,1,long>
                    (&local_78.m_value,&local_88.m_value,(long *)&pMStack_80,1);
          vStack_70.m_value = local_88.m_value * local_78.m_value;
          local_68 = local_78.m_value * (long)pMStack_80;
          local_40 = local_60;
          local_58._0_8_ = a_lhs;
          local_58._8_8_ = a_rhs;
          local_58._16_8_ = dst;
          local_38.m_value = (long)local_98;
          gemm_functor<double,_long,_Eigen::internal::general_matrix_matrix_product<long,_double,_0,_false,_double,_0,_false,_0,_1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_1,_false>_>
          ::operator()((gemm_functor<double,_long,_Eigen::internal::general_matrix_matrix_product<long,_double,_0,_false,_double,_0,_false,_0,_1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false>_>
                        *)local_58,0,
                       (a_lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                       m_storage.m_rows,0,
                       (a_rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                       m_storage.m_cols,(GemmParallelInfo<long> *)0x0);
          free((void *)local_98._0_8_);
          free((void *)local_98._8_8_);
          return;
        }
        local_98._0_8_ =
             (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
        local_88.m_value = (long)pMVar3;
        if ((long)pMVar3 < 0 && (double *)local_98._0_8_ != (double *)0x0) {
          pcVar6 = 
          "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, Level = 0]"
          ;
        }
        else {
          local_78.m_value = 0;
          vStack_70.m_value = 0;
          local_68 = 1;
          local_58._0_8_ =
               (a_lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
          local_58._16_8_ = lVar5;
          if (-1 < lVar5 ||
              (Matrix<double,__1,__1,_0,__1,__1> *)local_58._0_8_ ==
              (Matrix<double,__1,__1,_0,__1,__1> *)0x0) {
            local_38.m_value = 0;
            vStack_30.m_value = 0;
            local_28 = 1;
            local_40 = a_lhs;
            if (0 < lVar2) {
              pMStack_80 = dst;
              generic_product_impl<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,7>
              ::scaleAndAddTo<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>
                        ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_98,
                         (Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)
                         local_58,a_rhs,alpha);
              return;
            }
            pcVar6 = 
            "Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>::Block(XprType &, Index) [XprType = const Eigen::Matrix<double, -1, -1>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
            ;
            goto LAB_00140895;
          }
          pcVar6 = 
          "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>, Level = 0]"
          ;
          pMStack_80 = dst;
        }
      }
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/MapBase.h"
                    ,0xb2,pcVar6);
    }
  }
  __assert_fail("dst.rows()==a_lhs.rows() && dst.cols()==a_rhs.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/products/GeneralMatrixMatrix.h"
                ,0x1d6,
                "static void Eigen::internal::generic_product_impl<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, Eigen::DenseShape, Eigen::DenseShape, 8>::scaleAndAddTo(Dest &, const Lhs &, const Rhs &, const Scalar &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, -1>, LhsShape = Eigen::DenseShape, RhsShape = Eigen::DenseShape, ProductType = 8, Dest = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

static void scaleAndAddTo(Dest& dst, const Lhs& a_lhs, const Rhs& a_rhs, const Scalar& alpha)
  {
    eigen_assert(dst.rows()==a_lhs.rows() && dst.cols()==a_rhs.cols());
    if(a_lhs.cols()==0 || a_lhs.rows()==0 || a_rhs.cols()==0)
      return;

    if (dst.cols() == 1)
    {
      // Fallback to GEMV if either the lhs or rhs is a runtime vector
      typename Dest::ColXpr dst_vec(dst.col(0));
      return internal::generic_product_impl<Lhs,typename Rhs::ConstColXpr,DenseShape,DenseShape,GemvProduct>
        ::scaleAndAddTo(dst_vec, a_lhs, a_rhs.col(0), alpha);
    }
    else if (dst.rows() == 1)
    {
      // Fallback to GEMV if either the lhs or rhs is a runtime vector
      typename Dest::RowXpr dst_vec(dst.row(0));
      return internal::generic_product_impl<typename Lhs::ConstRowXpr,Rhs,DenseShape,DenseShape,GemvProduct>
        ::scaleAndAddTo(dst_vec, a_lhs.row(0), a_rhs, alpha);
    }

    typename internal::add_const_on_value_type<ActualLhsType>::type lhs = LhsBlasTraits::extract(a_lhs);
    typename internal::add_const_on_value_type<ActualRhsType>::type rhs = RhsBlasTraits::extract(a_rhs);

    Scalar actualAlpha = combine_scalar_factors(alpha, a_lhs, a_rhs);

    typedef internal::gemm_blocking_space<(Dest::Flags&RowMajorBit) ? RowMajor : ColMajor,LhsScalar,RhsScalar,
            Dest::MaxRowsAtCompileTime,Dest::MaxColsAtCompileTime,MaxDepthAtCompileTime> BlockingType;

    typedef internal::gemm_functor<
      Scalar, Index,
      internal::general_matrix_matrix_product<
        Index,
        LhsScalar, (ActualLhsTypeCleaned::Flags&RowMajorBit) ? RowMajor : ColMajor, bool(LhsBlasTraits::NeedToConjugate),
        RhsScalar, (ActualRhsTypeCleaned::Flags&RowMajorBit) ? RowMajor : ColMajor, bool(RhsBlasTraits::NeedToConjugate),
        (Dest::Flags&RowMajorBit) ? RowMajor : ColMajor,
        Dest::InnerStrideAtCompileTime>,
      ActualLhsTypeCleaned, ActualRhsTypeCleaned, Dest, BlockingType> GemmFunctor;

    BlockingType blocking(dst.rows(), dst.cols(), lhs.cols(), 1, true);
    internal::parallelize_gemm<(Dest::MaxRowsAtCompileTime>32 || Dest::MaxRowsAtCompileTime==Dynamic)>
        (GemmFunctor(lhs, rhs, dst, actualAlpha, blocking), a_lhs.rows(), a_rhs.cols(), a_lhs.cols(), Dest::Flags&RowMajorBit);
  }